

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsprg.cpp
# Opt level: O2

void __thiscall CTcParser::add_export_to_list(CTcParser *this,CTcPrsExport *exp)

{
  CTcPrsExport **ppCVar1;
  
  ppCVar1 = &this->exp_tail_->nxt_;
  if (this->exp_tail_ == (CTcPrsExport *)0x0) {
    ppCVar1 = &this->exp_head_;
  }
  *ppCVar1 = exp;
  this->exp_tail_ = exp;
  return;
}

Assistant:

void CTcParser::add_export_to_list(CTcPrsExport *exp)
{
    /* link it at the end of our list */
    if (exp_tail_ == 0)
        exp_head_ = exp;
    else
        exp_tail_->set_next(exp);
    exp_tail_ = exp;
}